

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

time_t license::seconds_from_epoch(char *timeString)

{
  int iVar1;
  size_t sVar2;
  invalid_argument *piVar3;
  time_t tVar4;
  int nfield_2;
  int nfield_1;
  undefined1 local_58 [4];
  int nfield;
  tm tm;
  int local_18;
  int day;
  int month;
  int year;
  char *timeString_local;
  
  _month = timeString;
  sVar2 = strlen(timeString);
  if (sVar2 == 8) {
    iVar1 = __isoc99_sscanf(_month,"%4d%2d%2d",&day,&local_18,(undefined1 *)((long)&tm.tm_zone + 4))
    ;
    if (iVar1 != 3) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Date not recognized");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    sVar2 = strlen(_month);
    if (sVar2 != 10) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Date not recognized");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar1 = __isoc99_sscanf(_month,"%4d-%2d-%2d",&day,&local_18,
                            (undefined1 *)((long)&tm.tm_zone + 4));
    if ((iVar1 != 3) &&
       (iVar1 = __isoc99_sscanf(_month,"%4d/%2d/%2d",&day,&local_18,
                                (undefined1 *)((long)&tm.tm_zone + 4)), iVar1 != 3)) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Date not recognized");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  tm.tm_wday = -1;
  tm.tm_mday = day + -0x76c;
  tm.tm_hour = local_18 + -1;
  tm.tm_min = tm.tm_zone._4_4_;
  tm.tm_sec = 0;
  nfield = 0;
  local_58 = (undefined1  [4])0x0;
  tm.tm_year = -1;
  tm.tm_mon = -1;
  tVar4 = mktime((tm *)local_58);
  return tVar4;
}

Assistant:

time_t seconds_from_epoch(const char* timeString) {
	int year, month, day;
	tm tm;
	if (strlen(timeString) == 8) {
		int nfield = sscanf(timeString, "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (strlen(timeString) == 10) {
		int nfield = sscanf(timeString, "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			int nfield = sscanf(timeString, "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date not recognized");
			}
		}
	} else{
		throw invalid_argument("Date not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}